

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat.h
# Opt level: O2

void wasm::Flat::verifyFlatness(Function *func)

{
  size_t in_RCX;
  uchar *in_R8;
  size_t in_R9;
  undefined1 auStack_f8 [8];
  VerifyFlatness verifier;
  
  auStack_f8 = (undefined1  [8])0x0;
  verifier.super_PostWalker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_>.
  super_Walker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_>.replacep =
       (Expression **)0x0;
  verifier.super_PostWalker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_>.
  super_Walker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_>.stack.fixed.
  _M_elems[9].currp = (Expression **)0x0;
  verifier.super_PostWalker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_>.
  super_Walker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_>.stack.flexible
  .
  super__Vector_base<wasm::Walker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_>::Task,_std::allocator<wasm::Walker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  verifier.super_PostWalker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_>.
  super_Walker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_>.stack.flexible
  .
  super__Vector_base<wasm::Walker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_>::Task,_std::allocator<wasm::Walker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  verifier.super_PostWalker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_>.
  super_Walker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_>.stack.flexible
  .
  super__Vector_base<wasm::Walker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_>::Task,_std::allocator<wasm::Walker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  verifier.super_PostWalker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_>.
  super_Walker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_>.currFunction =
       (Function *)0x0;
  Walker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_>::walkFunction
            ((Walker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_> *)
             auStack_f8,func);
  verifier.super_PostWalker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_>.
  super_Walker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_>.stack.flexible
  .
  super__Vector_base<wasm::Walker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_>::Task,_std::allocator<wasm::Walker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)func;
  verifyFlatness::VerifyFlatness::verify
            ((VerifyFlatness *)auStack_f8,(EVP_PKEY_CTX *)(ulong)((func->body->type).id < 2),
             (uchar *)"function bodies must not flow values",in_RCX,in_R8,in_R9);
  std::
  _Vector_base<wasm::Walker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_>::Task,_std::allocator<wasm::Walker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_>::Task>_>
  ::~_Vector_base((_Vector_base<wasm::Walker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_>::Task,_std::allocator<wasm::Walker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_>::Task>_>
                   *)((long)(verifier.
                             super_PostWalker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_>
                             .
                             super_Walker<VerifyFlatness,_wasm::UnifiedExpressionVisitor<VerifyFlatness,_void>_>
                             .stack.fixed._M_elems + 9) + 8));
  return;
}

Assistant:

inline void verifyFlatness(Function* func) {
  struct VerifyFlatness
    : public PostWalker<VerifyFlatness,
                        UnifiedExpressionVisitor<VerifyFlatness>> {
    void visitExpression(Expression* curr) {
      if (Properties::isControlFlowStructure(curr)) {
        verify(!curr->type.isConcrete(),
               "control flow structures must not flow values");
      } else if (auto* set = curr->dynCast<LocalSet>()) {
        verify(!set->isTee() || set->type == Type::unreachable,
               "tees are not allowed, only sets");
        verify(!Properties::isControlFlowStructure(set->value),
               "set values cannot be control flow");
      } else {
        for (auto* child : ChildIterator(curr)) {
          bool isRefAsNonNull =
            child->is<RefAs>() && child->cast<RefAs>()->op == RefAsNonNull;
          verify(Properties::isConstantExpression(child) ||
                   child->is<LocalGet>() || child->is<Unreachable>() ||
                   isRefAsNonNull,
                 "instructions must only have constant expressions, local.get, "
                 "or unreachable as children");
        }
      }
    }

    void verify(bool condition, const char* message) {
      if (!condition) {
        Fatal() << "IR must be flat: run --flatten beforehand (" << message
                << ", in " << getFunction()->name << ')';
      }
    }
  };

  VerifyFlatness verifier;
  verifier.walkFunction(func);
  verifier.setFunction(func);
  verifier.verify(!func->body->type.isConcrete(),
                  "function bodies must not flow values");
}